

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O0

uint64_t __thiscall helix::order_book::bid_price(order_book *this,size_t level)

{
  uint uVar1;
  bool bVar2;
  pointer ppVar3;
  long in_RSI;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_helix::price_level>_> *in_RDI;
  price_level *level_1;
  const_iterator it;
  map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  uint64_t local_8;
  
  local_18 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar2 = std::operator!=(&local_20,&local_28);
    uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (bVar2) {
      uVar1 = CONCAT13(local_18 != 0,(int3)in_stack_ffffffffffffffb4);
      local_18 = local_18 + -1;
    }
    in_stack_ffffffffffffffb4 = uVar1;
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
    local_30 = (_Base_ptr)
               std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_helix::price_level>_>::
               operator++(in_RDI,in_stack_ffffffffffffffb4);
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar2 = std::operator!=(&local_20,&local_38);
  if (bVar2) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_helix::price_level>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_helix::price_level>_>
                         *)0x13c0eb);
    local_8 = (ppVar3->second).price;
  }
  else {
    local_8 = std::numeric_limits<unsigned_long>::min();
  }
  return local_8;
}

Assistant:

uint64_t order_book::bid_price(size_t level) const
{
    auto it = _bids.begin();
    while (it != _bids.end() && level--) {
        it++;
    }
    if (it != _bids.end()) {
        auto&& level = it->second;
        return level.price;
    }
    return std::numeric_limits<uint64_t>::min();
}